

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool __thiscall
caffe::EmbedParameter::MergePartialFromCodedStream(EmbedParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  UnknownFieldSet *unknown_fields;
  FillerParameter *value;
  char cVar5;
  uint tag;
  ulong uVar6;
  uint32 *value_00;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0049f1e8;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0049f1e8:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    tag = (uint)uVar6;
    if ((uVar6 & 0x100000000) == 0) goto switchD_0049f252_default;
    cVar5 = (char)uVar6;
    switch((uint)(uVar6 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar5 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      value_00 = &this->num_output_;
LAB_0049f2c7:
      bVar3 = google::protobuf::io::CodedInputStream::ReadVarint32(input,value_00);
      goto LAB_0049f236;
    case 2:
      if (cVar5 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        value_00 = &this->input_dim_;
        goto LAB_0049f2c7;
      }
      break;
    case 3:
      if (cVar5 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->bias_term_);
        goto LAB_0049f236;
      }
      break;
    case 4:
      if (cVar5 == '\"') {
        value = mutable_weight_filler(this);
LAB_0049f2a3:
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<caffe::FillerParameter>(input,value);
        goto LAB_0049f236;
      }
      break;
    case 5:
      if (cVar5 == '*') {
        value = mutable_bias_filler(this);
        goto LAB_0049f2a3;
      }
    }
switchD_0049f252_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar3 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_0049f236:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool EmbedParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.EmbedParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 num_output = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_num_output();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &num_output_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 input_dim = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_input_dim();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &input_dim_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool bias_term = 3 [default = true];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_bias_term();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &bias_term_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter weight_filler = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weight_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter bias_filler = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.EmbedParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.EmbedParameter)
  return false;
#undef DO_
}